

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtk_writer.cc
# Opt level: O3

MatrixXd * lf::io::anon_unknown_1::AuxNodesTria(MatrixXd *__return_storage_ptr__,uchar order)

{
  DstEvaluatorType *pDVar1;
  MatrixXd *in_RAX;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar2;
  Scalar *pSVar3;
  MatrixXd *extraout_RAX;
  MatrixXd *extraout_RAX_00;
  uchar order_00;
  long blockCols;
  MatrixXd points;
  Matrix<double,__1,__1,_0,__1,__1> segment_points;
  SrcEvaluatorType srcEvaluator;
  DstEvaluatorType dstEvaluator;
  assign_op<double,_double> local_329;
  void *local_328;
  LhsNested local_320;
  uint local_314;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> local_310;
  void *local_2d8;
  variable_if_dynamic<long,__1> vStack_2d0;
  variable_if_dynamic<long,__1> vStack_2c8;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_2,__1,_0,_2,__1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_2b8;
  Product<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
  local_298;
  long local_270;
  DstEvaluatorType *local_268;
  Product<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_2,_1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_260;
  DenseStorage<double,__1,__1,__1,_0> local_238;
  Matrix<double,_2,__1,_0,_2,__1> local_220;
  plainobjectbase_evaluator_data<double,_2> local_210;
  undefined1 local_208 [16];
  variable_if_dynamic<long,__1> local_1f8;
  Lhs local_1e8;
  undefined1 local_1d8 [24];
  scalar_constant_op<double> local_1c0;
  variable_if_dynamic<long,__1> local_1b8;
  variable_if_dynamic<long,__1> local_1b0;
  scalar_constant_op<double> local_1a8;
  variable_if_dynamic<long,__1> local_1a0;
  scalar_constant_op<double> local_190;
  scalar_constant_op<double> local_178;
  void *local_168 [21];
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_c0;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_2,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_a8;
  
  if (order < 3) {
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
    m_storage.m_data = (double *)0x0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
    m_storage.m_rows = 0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
    m_storage.m_cols = 0;
  }
  else {
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
    m_storage.m_data = (double *)0x0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
    m_storage.m_rows = 0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
    m_storage.m_cols = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
              (&__return_storage_ptr__->
                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,2,
               (ulong)((order + 0xfffd) * (uint)order + 2 >> 1 & 0x7fff));
    if (order == '\x04') {
      local_a8.m_lhs._0_8_ = 0x3fd0000000000000;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::CommaInitializer
                ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_168,
                 __return_storage_ptr__,(Scalar *)&local_a8);
      local_1d8._0_8_ = 0.5;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_168,
                          (Scalar *)local_1d8);
      local_310.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data
           = (PointerType)0x3fd0000000000000;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar2,(Scalar *)&local_310);
      local_260.m_lhs.
      super_BlockImpl<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_2,_1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_2,_1,_false,_false>
      .m_xpr = (XprTypeNested)0x0;
      local_260.m_lhs.
      super_BlockImpl<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_2,_1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_2,_1,_false,_false>
      ._3_5_ = 0x3fd0000000;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar2,(Scalar *)&local_260);
      local_2b8.m_dst = (DstEvaluatorType *)0x3fd0000000000000;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar2,(Scalar *)&local_2b8);
      local_2d8 = (double *)0x3fe0000000000000;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                (pCVar2,(Scalar *)&local_2d8);
      in_RAX = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::finished
                         ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_168);
    }
    else if (order == 3) {
      local_a8.m_lhs._0_8_ = 0x3fd5555555555555;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::CommaInitializer
                ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_168,
                 __return_storage_ptr__,(Scalar *)&local_a8);
      local_1d8._0_8_ = 0.3333333333333333;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_168,
                 (Scalar *)local_1d8);
      in_RAX = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::finished
                         ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_168);
    }
    else {
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          __return_storage_ptr__,0,0);
      pDVar1 = (DstEvaluatorType *)(double)order;
      local_328 = (void *)(1.0 / (double)pDVar1);
      *pSVar3 = (Scalar)local_328;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          __return_storage_ptr__,1,0);
      *pSVar3 = (Scalar)local_328;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          __return_storage_ptr__,0,1);
      local_320 = (LhsNested)(((double)pDVar1 + -2.0) / (double)pDVar1);
      *pSVar3 = (Scalar)local_320;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          __return_storage_ptr__,1,1);
      *pSVar3 = (Scalar)local_328;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          __return_storage_ptr__,0,2);
      *pSVar3 = (Scalar)local_328;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          __return_storage_ptr__,1,2);
      *pSVar3 = (Scalar)local_320;
      local_314 = (uint)(byte)(order - 3);
      AuxNodesSegment((MatrixXd *)local_168,order - 3);
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
                (&local_238,(DenseStorage<double,__1,__1,__1,_0> *)local_168);
      free(local_168[0]);
      vStack_2d0.m_value = 0;
      vStack_2c8.m_value = 0;
      Eigen::
      Product<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_2,_1,_false>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>
      ::Product(&local_260,(Lhs *)&local_2d8,(Rhs *)&local_238);
      local_2b8.m_dst = (DstEvaluatorType *)((double)pDVar1 + -3.0);
      local_268 = local_2b8.m_dst;
      Eigen::
      CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_-1,_0,_2,_-1>_>
      ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,__1,_0,_2,__1>_>
                        *)&local_310,2,
                       ((local_260.m_rhs)->
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                       m_cols,(scalar_constant_op<double> *)&local_2b8);
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_2,_1,_false>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_-1,_0,_2,_-1>_>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_2,_1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,__1,_0,_2,__1>_>_>
                       *)local_1d8,&local_260,(Rhs *)&local_310,
                      (scalar_product_op<double,_double> *)&local_298);
      local_2b8.m_dst = pDVar1;
      Eigen::
      CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_-1,_0,_2,_-1>_>
      ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,__1,_0,_2,__1>_>
                        *)&local_310,2,local_1a0.m_value,(scalar_constant_op<double> *)&local_2b8);
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_2,_1,_false>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_-1,_0,_2,_-1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_-1,_0,_2,_-1>_>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_2,_1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,__1,_0,_2,__1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,__1,_0,_2,__1>_>_>
                       *)&local_a8,(Lhs *)local_1d8,(Rhs *)&local_310,
                      (scalar_quotient_op<double,_double> *)&local_298);
      local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
      [0] = (double)local_328;
      local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
      [1] = (double)local_328;
      local_270 = (ulong)order - 4;
      local_310.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data
           = (PointerType)0x3ff0000000000000;
      Eigen::
      CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
      ::CwiseNullaryOp(&local_c0,1,local_270,(scalar_constant_op<double> *)&local_310);
      Eigen::
      Product<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_0>
      ::Product(&local_298,&local_1e8,&local_c0);
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_2,_1,_false>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_-1,_0,_2,_-1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_-1,_0,_2,_-1>_>_>,_const_Eigen::Product<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_0>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_2,_1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,__1,_0,_2,__1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,__1,_0,_2,__1>_>_>,_const_Eigen::Product<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
                       *)local_168,(Lhs *)&local_a8,&local_298,
                      (scalar_sum_op<double,_double> *)&local_310);
      blockCols = (long)(int)(order - 4);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                (&local_310,__return_storage_ptr__,0,3,2,blockCols);
      Eigen::Matrix<double,2,-1,0,2,-1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,2,2,0,2,2>>const,2,1,false>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,_1,0,2,_1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,_1,0,2,_1>const>const>const,Eigen::Product<Eigen::Matrix<double,2,1,0,2,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>const>>
                ((Matrix<double,2,_1,0,2,_1> *)&local_220,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_2,_1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,__1,_0,_2,__1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,__1,_0,_2,__1>_>_>,_const_Eigen::Product<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
                  *)local_168);
      local_210.data =
           local_220.super_PlainObjectBase<Eigen::Matrix<double,_2,__1,_0,_2,__1>_>.m_storage.m_data
      ;
      Eigen::internal::
      resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Matrix<double,2,_1,0,2,_1>,double,double>
                (&local_310,&local_220,&local_329);
      local_2b8.m_dst = (DstEvaluatorType *)local_208;
      local_208._0_8_ =
           local_310.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
           m_data;
      local_1f8.m_value =
           *(Index *)((long)local_310.
                            super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                            .
                            super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                            .m_xpr + 8);
      local_2b8.m_src = (SrcEvaluatorType *)&local_210;
      local_2b8.m_functor = &local_329;
      local_2b8.m_dstExpr = &local_310;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_2,_-1,_0,_2,_-1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
      ::run(&local_2b8);
      free(local_220.super_PlainObjectBase<Eigen::Matrix<double,_2,__1,_0,_2,__1>_>.m_storage.m_data
          );
      local_2d8 = (double *)0xbff0000000000000;
      vStack_2d0.m_value = 0x3ff0000000000000;
      local_1d8._8_8_ = &local_2d8;
      local_1c0.m_other = (double)local_268;
      local_1a8.m_other = (double)pDVar1;
      Eigen::
      Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>
      ::Product((Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
                 *)&local_a8,(Lhs *)local_1d8,(Rhs *)&local_238);
      local_298.m_lhs = local_320;
      local_298.m_rhs.m_rows.m_value = (long)local_328;
      local_310.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data
           = (PointerType)0x3ff0000000000000;
      Eigen::
      CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
      ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                        *)&local_2b8,1,local_270,(scalar_constant_op<double> *)&local_310);
      Eigen::
      Product<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_0>
      ::Product((Product<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
                 *)&local_260,(Lhs *)&local_298,(Rhs *)&local_2b8);
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_0>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
                       *)local_168,(Lhs *)&local_a8,(Rhs *)&local_260,
                      (scalar_sum_op<double,_double> *)&local_310);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                (&local_310,__return_storage_ptr__,0,(ulong)(order - 1),2,blockCols);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const,Eigen::Product<Eigen::Matrix<double,2,1,0,2,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>const>,Eigen::internal::assign_op<double,double>>
                (&local_310,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
                  *)local_168,(assign_op<double,_double> *)local_208,(type)0x0);
      local_1b8.m_value = 0;
      local_1b0.m_value = 1;
      local_190.m_other = (double)local_268;
      local_178.m_other = (double)pDVar1;
      Eigen::
      Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_2,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>
      ::Product(&local_a8,(Lhs *)local_1d8,(Rhs *)&local_238);
      local_2d8 = local_328;
      vStack_2d0.m_value = (long)local_320;
      local_310.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data
           = (PointerType)0x3ff0000000000000;
      Eigen::
      CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
      ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                        *)&local_2b8,1,local_270,(scalar_constant_op<double> *)&local_310);
      Eigen::
      Product<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_0>
      ::Product((Product<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
                 *)&local_260,(Lhs *)&local_2d8,(Rhs *)&local_2b8);
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_2,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_0>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_2,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
                       *)local_168,&local_a8,(Rhs *)&local_260,
                      (scalar_sum_op<double,_double> *)&local_310);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                (&local_310,__return_storage_ptr__,0,(ulong)((uint)order * 2 - 5),2,blockCols);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,2,2,0,2,2>>const,2,1,false>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const,Eigen::Product<Eigen::Matrix<double,2,1,0,2,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>const>,Eigen::internal::assign_op<double,double>>
                (&local_310,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_2,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
                  *)local_168,(assign_op<double,_double> *)&local_298,(type)0x0);
      free(local_238.m_data);
      in_RAX = extraout_RAX;
      if (5 < order) {
        order_00 = (uchar)local_314;
        AuxNodesTria((MatrixXd *)&local_2b8,order_00);
        AuxNodesTria((MatrixXd *)&local_2d8,order_00);
        local_260.m_lhs.
        super_BlockImpl<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_2,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_2,_1,_false,_false>
        ._0_8_ = (double)pDVar1 + -6.0;
        Eigen::
        CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
        ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                          *)local_1d8,vStack_2d0.m_value,vStack_2c8.m_value,
                         (scalar_constant_op<double> *)&local_260);
        Eigen::
        CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
        ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                         *)&local_310,(Lhs *)&local_2d8,(Rhs *)local_1d8,
                        (scalar_product_op<double,_double> *)&local_298);
        local_260.m_lhs.
        super_BlockImpl<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_2,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_2,_1,_false,_false>
        ._0_8_ = pDVar1;
        Eigen::
        CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
        ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                          *)local_1d8,
                         local_310.
                         super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                         .
                         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                         .
                         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                         .
                         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                         .m_rows.m_value,
                         local_310.
                         super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                         .
                         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                         .
                         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                         .
                         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                         .m_cols.m_value,(scalar_constant_op<double> *)&local_260);
        Eigen::
        CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
        ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                         *)&local_a8,(Lhs *)&local_310,(Rhs *)local_1d8,
                        (scalar_quotient_op<double,_double> *)&local_298);
        local_208._0_8_ = 2.0 / (double)pDVar1;
        local_1d8._0_8_ = 1.0;
        local_208._8_8_ = local_208._0_8_;
        Eigen::
        CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
        ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                          *)&local_298,1,(Index)local_2b8.m_functor,
                         (scalar_constant_op<double> *)local_1d8);
        Eigen::
        Product<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_0>
        ::Product((Product<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
                   *)&local_260,(Lhs *)local_208,(Rhs *)&local_298);
        Eigen::
        CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_const_Eigen::Product<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_0>_>
        ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::Product<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
                         *)local_168,(Lhs *)&local_a8,(Rhs *)&local_260,
                        (scalar_sum_op<double,_double> *)local_1d8);
        Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                  ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_1d8,
                   __return_storage_ptr__,0,(ulong)order * 3 + -9,2,(Index)local_2b8.m_functor);
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const,Eigen::Product<Eigen::Matrix<double,2,1,0,2,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>const>,Eigen::internal::assign_op<double,double>>
                  ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_1d8,
                   (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::Product<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
                    *)local_168,(assign_op<double,_double> *)&local_238,(type)0x0);
        free(local_2d8);
        free(local_2b8.m_dst);
        in_RAX = extraout_RAX_00;
      }
    }
  }
  return in_RAX;
}

Assistant:

Eigen::MatrixXd AuxNodesTria(unsigned char order) {
  if (order < 3) {
    return {};
  }
  Eigen::MatrixXd result(2, NumAuxNodes(base::RefEl::kTria(), order));
  if (order == 3) {
    result << 1. / 3., 1. / 3.;
  } else if (order == 4) {
    result << 0.25, 0.5, 0.25, 0.25, 0.25, 0.5;
  } else {
    // assign nodes:
    result(0, 0) = 1. / order;
    result(1, 0) = 1. / order;
    result(0, 1) = (order - 2.) / order;
    result(1, 1) = 1. / order;
    result(0, 2) = 1. / order;
    result(1, 2) = (order - 2.) / order;

    if (order > 4) {
      auto segment_points = AuxNodesSegment(order - 3).eval();
      // assign edges:
      result.block(0, 3, 2, order - 4) =
          Eigen::Vector2d::UnitX() * segment_points * (order - 3.) / order +
          Eigen::Vector2d(1. / order, 1. / order) *
              Eigen::MatrixXd::Ones(1, order - 4);
      result.block(0, order - 1, 2, order - 4) =
          Eigen::Vector2d(-1, 1) * (order - 3.) / order * segment_points +
          Eigen::Vector2d((order - 2.) / order, 1. / order) *
              Eigen::MatrixXd::Ones(1, order - 4);
      result.block(0, 2 * order - 5, 2, order - 4) =
          -Eigen::Vector2d::UnitY() * (order - 3.) / order * segment_points +
          Eigen::Vector2d(1. / order, (order - 2.) / order) *
              Eigen::MatrixXd::Ones(1, order - 4);
    }
    if (order > 5) {
      // assign interior points recursively:
      auto points = AuxNodesTria(order - 3);
      result.block(0, 3 * order - 9, 2, points.cols()) =
          AuxNodesTria(order - 3) * (order - 6.) / order +
          Eigen::Vector2d(2. / order, 2. / order) *
              Eigen::MatrixXd::Ones(1, points.cols());
    }
  }
  return result;
}